

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

ASMFunction lj_dispatch_call(lua_State *L,BCIns *pc)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  TValue *pTVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  piVar7 = __errno_location();
  iVar3 = *piVar7;
  uVar9 = (ulong)L->base[-1].u32.lo;
  uVar10 = (ulong)(L->glref).ptr32;
  if (*(char *)(uVar9 + 6) == '\0') {
    uVar9 = (ulong)*(uint *)(uVar9 + 0x10);
    bVar2 = *(byte *)(uVar9 - 0x3a);
    iVar5 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    iVar11 = iVar5 + 1;
    if ((*(byte *)(uVar9 - 0x1b) & 2) == 0) {
      iVar11 = 0;
    }
    uVar6 = iVar11 + (uint)*(byte *)(uVar9 - 0x39);
    lVar8 = (ulong)(L->maxstack).ptr32 - (long)L->top;
    lVar1 = (ulong)uVar6 * 8;
    if (lVar8 == lVar1 || SBORROW8(lVar8,lVar1) != (long)(lVar8 + (ulong)uVar6 * -8) < 0) {
      lj_state_growstack(L,uVar6);
    }
    iVar5 = (uint)bVar2 - iVar5;
    iVar11 = 0;
    if (0 < iVar5) {
      iVar11 = iVar5;
    }
  }
  else {
    iVar11 = 0;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0xa1) {
      lj_state_growstack(L,0x14);
      iVar11 = 0;
    }
  }
  *(lua_State **)(uVar10 + 0x1f8) = L;
  if (((ulong)pc & 1) == 0) {
    if ((*(int *)(uVar10 + 0x254) != 0) && ((*(byte *)(uVar10 + 0x91) & 0x60) == 0)) {
      lj_trace_ins((jit_State *)(uVar10 + 0x198),pc + -1);
    }
    if ((*(byte *)(uVar10 + 0x91) & 1) != 0) {
      iVar5 = iVar11;
      if (iVar11 == 0) {
        callhook(L,0,-1);
      }
      else {
        do {
          pTVar4 = L->top;
          L->top = pTVar4 + 1;
          (pTVar4->field_2).it = 0xffffffff;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        callhook(L,0,-1);
        iVar11 = iVar11 + 1;
        pTVar4 = L->top;
        do {
          if (*(int *)((long)pTVar4 + -4) != -1) break;
          L->top = pTVar4 + -1;
          iVar11 = iVar11 + -1;
          pTVar4 = pTVar4 + -1;
        } while (1 < iVar11);
      }
    }
  }
  else {
    pc = (BCIns *)((ulong)pc & 0xfffffffffffffffe);
    lj_trace_hot((jit_State *)(uVar10 + 0x198),pc);
  }
  bVar2 = (byte)pc[-1];
  uVar6 = (uint)bVar2;
  if ((((*(byte *)(uVar10 + 0x220) & 1) == 0) || (*(int *)(uVar10 + 0x254) != 0)) &&
     ((bVar2 == 0x58 || (bVar2 == 0x55)))) {
    uVar6 = bVar2 + 1;
  }
  *piVar7 = iVar3;
  return lj_BC_ISLT + lj_bc_ofs[uVar6];
}

Assistant:

ASMFunction LJ_FASTCALL lj_dispatch_call(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  BCOp op;
  global_State *g = G(L);
#if LJ_HASJIT
  jit_State *J = G2J(g);
#endif
  int missing = call_init(L, fn);
#if LJ_HASJIT
  J->L = L;
  if ((uintptr_t)pc & 1) {  /* Marker for hot call. */
#ifdef LUA_USE_ASSERT
    ptrdiff_t delta = L->top - L->base;
#endif
    pc = (const BCIns *)((uintptr_t)pc & ~(uintptr_t)1);
    lj_trace_hot(J, pc);
    lua_assert(L->top - L->base == delta);
    goto out;
  } else if (J->state != LJ_TRACE_IDLE &&
	     !(g->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
#ifdef LUA_USE_ASSERT
    ptrdiff_t delta = L->top - L->base;
#endif
    /* Record the FUNC* bytecodes, too. */
    lj_trace_ins(J, pc-1);  /* The interpreter bytecode PC is offset by 1. */
    lua_assert(L->top - L->base == delta);
  }
#endif
  if ((g->hookmask & LUA_MASKCALL)) {
    int i;
    for (i = 0; i < missing; i++)  /* Add missing parameters. */
      setnilV(L->top++);
    callhook(L, LUA_HOOKCALL, -1);
    /* Preserve modifications of missing parameters by lua_setlocal(). */
    while (missing-- > 0 && tvisnil(L->top - 1))
      L->top--;
  }
#if LJ_HASJIT
out:
#endif
  op = bc_op(pc[-1]);  /* Get FUNC* op. */
#if LJ_HASJIT
  /* Use the non-hotcounting variants if JIT is off or while recording. */
  if ((!(J->flags & JIT_F_ON) || J->state != LJ_TRACE_IDLE) &&
      (op == BC_FUNCF || op == BC_FUNCV))
    op = (BCOp)((int)op+(int)BC_IFUNCF-(int)BC_FUNCF);
#endif
  ERRNO_RESTORE
  return makeasmfunc(lj_bc_ofs[op]);  /* Return static dispatch target. */
}